

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O0

void __thiscall QPDFPageObjectHelper::pipeContents(QPDFPageObjectHelper *this,Pipeline *p)

{
  bool bVar1;
  undefined1 local_58 [48];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  Pipeline *p_local;
  QPDFPageObjectHelper *this_local;
  
  local_18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p;
  p_local = (Pipeline *)this;
  QPDFObjectHelper::oh((QPDFObjectHelper *)&stack0xffffffffffffffd8);
  bVar1 = QPDFObjectHandle::isFormXObject((QPDFObjectHandle *)&stack0xffffffffffffffd8);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffffd8);
  if (bVar1) {
    QPDFObjectHelper::oh((QPDFObjectHelper *)(local_58 + 0x10));
    QPDFObjectHandle::pipeStreamData
              ((QPDFObjectHandle *)(local_58 + 0x10),(Pipeline *)local_18._M_pi,0,
               qpdf_dl_specialized,false,false);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_58 + 0x10));
  }
  else {
    QPDFObjectHelper::oh((QPDFObjectHelper *)local_58);
    QPDFObjectHandle::pipePageContents((QPDFObjectHandle *)local_58,(Pipeline *)local_18._M_pi);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_58);
  }
  return;
}

Assistant:

void
QPDFPageObjectHelper::pipeContents(Pipeline* p)
{
    if (oh().isFormXObject()) {
        oh().pipeStreamData(p, 0, qpdf_dl_specialized);
    } else {
        oh().pipePageContents(p);
    }
}